

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
          (IterationLogSectionEmitter *this,TestLog *log,size_t testIteration,size_t testIterations,
          string *description,bool enabled)

{
  TestLog *pTVar1;
  ostream *poVar2;
  void *__buf;
  undefined3 in_register_00000089;
  ostringstream buf;
  string local_220;
  string local_200;
  LogSection local_1e0;
  ostringstream local_1a0 [376];
  
  this->m_log = log;
  this->m_enabled = enabled;
  if (CONCAT31(in_register_00000089,enabled) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,"Iteration ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"/");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    if (description->_M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)local_1a0," - ");
      std::operator<<(poVar2,(string *)description);
    }
    pTVar1 = this->m_log;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    tcu::LogSection::LogSection(&local_1e0,&local_200,&local_220);
    tcu::LogSection::write(&local_1e0,(int)pTVar1,__buf,testIterations);
    tcu::LogSection::~LogSection(&local_1e0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return;
}

Assistant:

IterationLogSectionEmitter::IterationLogSectionEmitter (tcu::TestLog& log, size_t testIteration, size_t testIterations, const std::string& description, bool enabled)
	: m_log		(log)
	, m_enabled	(enabled)
{
	if (m_enabled)
	{
		std::ostringstream buf;
		buf << "Iteration " << (testIteration+1) << "/" << testIterations;

		if (!description.empty())
			buf << " - " << description;

		m_log << tcu::TestLog::Section(buf.str(), buf.str());
	}
}